

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (Result<CBlockIndex_*> *__return_storage_ptr__,ChainstateManager *this,
          AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  RecursiveMutex *pRVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  size_t sVar7;
  pointer ppCVar8;
  CTxMemPool *this_00;
  double dVar9;
  double dVar10;
  string original;
  optional<uint256> from_snapshot_blockhash;
  path leveldb_name;
  base_blob<256U> *pbVar11;
  undefined1 auVar12 [8];
  pointer piVar13;
  undefined8 uVar14;
  bool bVar15;
  Chainstate *__tmp;
  CBlockIndex *pCVar16;
  Chainstate *pCVar17;
  __uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true> this_01;
  unsigned_long uVar18;
  CBlockIndex *pCVar19;
  _Optional_payload_base<int> _Var20;
  CCoinsViewCache *this_02;
  size_t sVar21;
  SnapshotMetadata *args;
  ulong uVar22;
  CBlockIndex *pb;
  undefined1 *puVar23;
  _Head_base<0UL,_Chainstate_*,_false> _Var24;
  ulong uVar25;
  _Base_ptr p_Var26;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  __single_object snapshot_chainstate;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  string heights_formatted;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  string ret;
  uint256 base_blockhash;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffff9ec;
  undefined4 uVar28;
  undefined8 in_stack_fffffffffffff9f0;
  char *pcVar29;
  undefined8 in_stack_fffffffffffff9f8;
  string *args_00;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 uVar30;
  string sVar31;
  undefined7 in_stack_fffffffffffffa09;
  undefined1 local_5b0 [8];
  vector<int,_std::allocator<int>_> local_5a8;
  unique_lock<std::recursive_mutex> local_590;
  _Base_ptr local_580;
  long local_578;
  _Base_ptr local_570 [2];
  undefined1 local_560 [32];
  _Alloc_hider local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  undefined1 local_520 [64];
  _Base_ptr local_4e0;
  _Base_ptr local_4d8;
  _Base_ptr local_4d0 [2];
  undefined1 local_4c0 [32];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  Error local_480;
  undefined1 local_440 [32];
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Base_ptr *local_400;
  long local_3f8;
  _Base_ptr local_3f0 [2];
  undefined1 local_3e0 [8];
  bool local_3d8;
  undefined7 uStack_3d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined1 local_3a0 [64];
  Error local_360;
  path local_320;
  _Base_ptr local_2f8 [2];
  undefined1 local_2e8 [24];
  _Base_ptr local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 *local_2b8;
  undefined1 local_2b0 [24];
  _Base_ptr local_298;
  _Base_ptr local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  _Base_ptr local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  _Base_ptr p_Stack_260;
  undefined1 *local_258;
  undefined1 local_250 [24];
  _Base_ptr local_238;
  _Base_ptr local_230;
  undefined1 local_228 [24];
  _Base_ptr local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 *local_1f8;
  undefined1 local_1f0 [24];
  ChainstateManager *local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8 [24];
  CBlockIndex *local_1b0;
  __native_type local_1a8;
  _Base_ptr p_Stack_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  undefined1 local_168 [24];
  _Base_ptr local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  size_t local_138;
  undefined1 local_130 [24];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  string local_f8 [16];
  undefined8 local_e8 [4];
  bool local_c8;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8 [2];
  _Base_ptr local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  _Rb_tree_header *local_78;
  _Rb_tree_impl<std::less<const_CBlockIndex_*>,_true> local_70;
  _Rb_tree_color _Stack_40;
  undefined4 uStack_3c;
  _Base_ptr local_38;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,in_memory);
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_70.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  local_70.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  pbVar11 = &(metadata->m_base_blockhash).super_base_blob<256U>;
  local_70.super__Rb_tree_header._M_node_count._0_1_ = (pbVar11->m_data)._M_elems[0x10];
  local_70.super__Rb_tree_header._M_node_count._1_1_ = (pbVar11->m_data)._M_elems[0x11];
  local_70.super__Rb_tree_header._M_node_count._2_1_ = (pbVar11->m_data)._M_elems[0x12];
  local_70.super__Rb_tree_header._M_node_count._3_1_ = (pbVar11->m_data)._M_elems[0x13];
  pbVar11 = &(metadata->m_base_blockhash).super_base_blob<256U>;
  local_70.super__Rb_tree_header._M_node_count._4_1_ = (pbVar11->m_data)._M_elems[0x14];
  local_70.super__Rb_tree_header._M_node_count._5_1_ = (pbVar11->m_data)._M_elems[0x15];
  local_70.super__Rb_tree_header._M_node_count._6_1_ = (pbVar11->m_data)._M_elems[0x16];
  local_70.super__Rb_tree_header._M_node_count._7_1_ = (pbVar11->m_data)._M_elems[0x17];
  _Stack_40 = *(_Rb_tree_color *)
               ((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  pbVar11 = &(metadata->m_base_blockhash).super_base_blob<256U>;
  uStack_3c._0_1_ = (pbVar11->m_data)._M_elems[0x1c];
  uStack_3c._1_1_ = (pbVar11->m_data)._M_elems[0x1d];
  uStack_3c._2_1_ = (pbVar11->m_data)._M_elems[0x1e];
  uStack_3c._3_1_ = (pbVar11->m_data)._M_elems[0x1f];
  args = metadata;
  SnapshotBlockhash((optional<uint256> *)local_118,this);
  if (local_f8[0] == (string)0x1) {
    local_b8 = (_Base_ptr)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Can\'t activate a snapshot-based chainstate more than once","");
    local_98 = (_Base_ptr)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8,(long)&local_b8->_M_color + (long)&local_b0->_M_color);
    p_Var2 = &local_70.super__Rb_tree_header;
    local_78 = p_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8,(long)&local_b8->_M_color + (long)&local_b0->_M_color);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if (local_98 == (_Base_ptr)local_88) {
      *puVar1 = CONCAT71(local_88._1_7_,local_88[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_88._8_8_;
    }
    else {
      *(_Base_ptr *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_88._1_7_,local_88[0]);
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_90;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_78 == p_Var2) {
      *puVar1 = CONCAT71(local_70.super__Rb_tree_header._M_header._1_7_,
                         (undefined1)local_70.super__Rb_tree_header._M_header._M_color);
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
           local_70.super__Rb_tree_header._M_header._M_parent;
    }
    else {
      *(_Rb_tree_header **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_70.super__Rb_tree_header._M_header._1_7_,
                    (undefined1)local_70.super__Rb_tree_header._M_header._M_color);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_70._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_70.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_70._0_8_ = 0;
    local_88[0] = 0;
    local_90 = (_Base_ptr)0x0;
    local_98 = (_Base_ptr)local_88;
    local_78 = p_Var2;
    if (local_b8 != (_Base_ptr)local_a8) {
      operator_delete(local_b8,(ulong)((long)&local_a8[0]->_M_color + 1));
    }
    goto LAB_0041e06b;
  }
  local_590._M_device = &cs_main.super_recursive_mutex;
  local_590._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_590);
  CChainParams::AssumeutxoForBlockhash
            ((optional<AssumeutxoData> *)local_118,(this->m_options).chainparams,
             (uint256 *)&local_70.super__Rb_tree_header._M_header._M_left);
  if (local_c8 == false) {
    CChainParams::GetAvailableSnapshotHeights(&local_5a8,(this->m_options).chainparams);
    piVar13 = local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_118._0_8_ = local_118 + 0x10;
    local_118._8_8_ = 0;
    local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
    if (local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      bVar15 = true;
      _Var24._M_head_impl =
           (Chainstate *)
           local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      do {
        if (!bVar15) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     ", ");
        }
        util::ToString<int>((string *)local_3e0,(int *)_Var24._M_head_impl);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (char *)local_3e0,CONCAT71(uStack_3d7,local_3d8));
        if (local_3e0 != (undefined1  [8])&local_3d0) {
          operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
        }
        _Var24._M_head_impl =
             (Chainstate *)
             (((_Var24._M_head_impl)->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex.
              __size + 4);
        bVar15 = false;
      } while (_Var24._M_head_impl != (Chainstate *)piVar13);
    }
    pRVar3 = (RecursiveMutex *)(local_118 + 0x10);
    if ((RecursiveMutex *)local_118._0_8_ == pRVar3) {
      local_440._24_4_ = local_108._8_4_;
      local_440._28_4_ = local_108._12_4_;
      local_440._0_8_ = (RecursiveMutex *)(local_440 + 0x10);
    }
    else {
      local_440._0_8_ = local_118._0_8_;
    }
    local_440._16_8_ = local_108._0_8_;
    local_440._8_8_ = local_118._8_8_;
    local_178 = (_Base_ptr)local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,
               "assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"
               ,"");
    local_118._0_8_ = pRVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_178,
               (undefined1 *)((long)&local_170->_M_color + (long)local_178));
    local_f8._0_8_ = local_e8;
    std::__cxx11::string::_M_construct<char*>
              (local_f8,local_178,(undefined1 *)((long)&local_170->_M_color + (long)local_178));
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)local_3e0,&local_70.super__Rb_tree_header._M_header._M_left);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((bilingual_str *)(local_168 + 0x10),(tinyformat *)local_118,
               (bilingual_str *)local_3e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,args_1
              );
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._16_8_ == &local_148) {
      *puVar1 = CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_148._8_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_168._16_8_;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
    }
    sVar21 = (long)local_130 + 8;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_150;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_138 == sVar21) {
      *puVar1 = CONCAT71(local_130._9_7_,local_130[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_130._16_8_
      ;
    }
    else {
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_138;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_130._9_7_,local_130[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_130._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_130[8] = _S_red;
    local_130._0_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_150 = (_Base_ptr)0x0;
    local_168._16_8_ = &local_148;
    local_138 = sVar21;
    if (local_3e0 != (undefined1  [8])&local_3d0) {
      operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
    }
    if ((undefined8 *)local_f8._0_8_ != local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
    }
    if ((RecursiveMutex *)local_118._0_8_ != pRVar3) {
      operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
    }
    if (local_178 != (_Base_ptr)local_168) {
      operator_delete(local_178,local_168._0_8_ + 1);
    }
    if ((RecursiveMutex *)local_440._0_8_ != (RecursiveMutex *)(local_440 + 0x10)) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    if ((Chainstate *)
        local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (Chainstate *)0x0) {
      puVar23 = (undefined1 *)
                ((long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                (long)local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var24._M_head_impl =
           (Chainstate *)
           local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
LAB_0041d61e:
      operator_delete(_Var24._M_head_impl,(ulong)puVar23);
    }
LAB_0041d623:
    pCVar16 = (CBlockIndex *)0x0;
LAB_0041d6f5:
    bVar15 = false;
  }
  else {
    pCVar16 = ::node::BlockManager::LookupBlockIndex
                        (&this->m_blockman,
                         (uint256 *)&local_70.super__Rb_tree_header._M_header._M_left);
    if (pCVar16 == (CBlockIndex *)0x0) {
      local_1d8 = (ChainstateManager *)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,
                 "The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"
                 ,"");
      local_118._0_8_ = (RecursiveMutex *)(local_118 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,local_1d8,
                 &(local_1d8->m_warningcache)._M_elems[0]._M_t._M_impl.field_0x0 +
                 (long)&local_1d0[-2]._M_left);
      local_f8._0_8_ = local_e8;
      std::__cxx11::string::_M_construct<char*>
                (local_f8,local_1d8,
                 &(local_1d8->m_warningcache)._M_elems[0]._M_t._M_impl.field_0x0 +
                 (long)&local_1d0[-2]._M_left);
      base_blob<256u>::ToString_abi_cxx11_
                ((string *)local_3e0,&local_70.super__Rb_tree_header._M_header._M_left);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)(local_1c8 + 0x10),(tinyformat *)local_118,
                 (bilingual_str *)local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if ((__native_type *)local_1c8._16_8_ == &local_1a8) {
        *puVar1 = CONCAT71(local_1a8.__align._1_7_,local_1a8.__size[0]);
        ((duration *)
        ((long)&(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_CBlockIndex_*>.
                super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
             local_1a8._8_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_1c8._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_1a8.__align._1_7_,local_1a8.__size[0]);
      }
      pcVar29 = local_1a8.__size + 0x20;
      *(CBlockIndex **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_1b0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((char *)local_1a8._16_8_ == pcVar29) {
        *puVar1 = CONCAT71(local_1a8._33_7_,local_1a8.__size[0x20]);
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = p_Stack_180;
      }
      else {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_1a8._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_1a8._33_7_,local_1a8.__size[0x20]);
      }
      *(__pthread_internal_list **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_1a8.__data.__list.__prev;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_1a8.__size[0x20] = '\0';
      local_1a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
      local_1a8.__size[0] = '\0';
      local_1b0 = (CBlockIndex *)0x0;
      local_1c8._16_8_ = &local_1a8;
      local_1a8._16_8_ = pcVar29;
      if (local_3e0 != (undefined1  [8])&local_3d0) {
        operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
      }
      if ((undefined8 *)local_f8._0_8_ != local_e8) {
        operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
      }
      if ((RecursiveMutex *)local_118._0_8_ != (RecursiveMutex *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
      }
      if (local_1d8 != (ChainstateManager *)local_1c8) {
        puVar23 = (undefined1 *)(local_1c8._0_8_ + 1);
        _Var24._M_head_impl = (Chainstate *)local_1d8;
        goto LAB_0041d61e;
      }
      goto LAB_0041d623;
    }
    if ((pCVar16->nStatus & 0x60) != 0) {
      local_238 = (_Base_ptr)local_228;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"The base block header (%s) is part of an invalid chain","");
      local_118._0_8_ = (RecursiveMutex *)(local_118 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,local_238,
                 (undefined1 *)((long)&local_238->_M_color + (long)&local_230->_M_color));
      local_f8._0_8_ = local_e8;
      std::__cxx11::string::_M_construct<char*>
                (local_f8,local_238,
                 (undefined1 *)((long)&local_238->_M_color + (long)&local_230->_M_color));
      base_blob<256u>::ToString_abi_cxx11_
                ((string *)local_3e0,&local_70.super__Rb_tree_header._M_header._M_left);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)(local_228 + 0x10),(tinyformat *)local_118,
                 (bilingual_str *)local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._16_8_ == &local_208) {
        *puVar1 = CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_208._8_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_228._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
      }
      puVar23 = local_1f0 + 8;
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_210;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if (local_1f8 == puVar23) {
        *puVar1 = CONCAT71(local_1f0._9_7_,local_1f0[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_1f0._16_8_;
      }
      else {
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_1f8;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_1f0._9_7_,local_1f0[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_1f0._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_1f0[8] = _S_red;
      local_1f0._0_8_ = 0;
      local_208._M_local_buf[0] = '\0';
      local_210 = (_Base_ptr)0x0;
      local_228._16_8_ = &local_208;
      local_1f8 = puVar23;
      if (local_3e0 != (undefined1  [8])&local_3d0) {
        operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
      }
      if ((undefined8 *)local_f8._0_8_ != local_e8) {
        operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
      }
      if ((RecursiveMutex *)local_118._0_8_ != (RecursiveMutex *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
      }
      p_Var26 = local_238;
      if (local_238 != (_Base_ptr)local_228) {
LAB_0041d6ed:
        operator_delete(p_Var26,local_228._0_8_ + 1);
      }
      goto LAB_0041d6f5;
    }
    if ((this->m_best_header == (CBlockIndex *)0x0) ||
       (pCVar19 = CBlockIndex::GetAncestor(this->m_best_header,pCVar16->nHeight), pCVar19 != pCVar16
       )) {
      local_298 = (_Base_ptr)local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,
                 "A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo."
                 ,"");
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_298,
                 (undefined1 *)((long)&local_298->_M_color + (long)&local_290->_M_color));
      puVar23 = local_250 + 8;
      local_258 = puVar23;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_298,
                 (undefined1 *)((long)&local_298->_M_color + (long)&local_290->_M_color));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if (local_278 == &local_268) {
        *puVar1 = CONCAT71(uStack_267,local_268);
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = p_Stack_260;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_278;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(uStack_267,local_268);
      }
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_270;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if (local_258 == puVar23) {
        *puVar1 = CONCAT71(local_250._9_7_,local_250[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_250._16_8_;
      }
      else {
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_258;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_250._9_7_,local_250[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_250._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_250[8] = _S_red;
      local_250._0_8_ = 0;
      local_268 = 0;
      local_270 = (_Base_ptr)0x0;
      local_228._0_8_ = local_288._0_8_;
      p_Var26 = local_298;
      local_278 = &local_268;
      local_258 = puVar23;
      if (local_298 != (_Base_ptr)local_288) goto LAB_0041d6ed;
      goto LAB_0041d6f5;
    }
    this_00 = this->m_active_chainstate->m_mempool;
    bVar15 = true;
    if ((this_00 != (CTxMemPool *)0x0) && (uVar18 = CTxMemPool::size(this_00), uVar18 != 0)) {
      local_2f8[0] = (_Base_ptr)local_2e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,"Can\'t activate a snapshot when mempool not empty","");
      original._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9ec;
      original._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9e8;
      original._M_string_length = in_stack_fffffffffffff9f0;
      original.field_2._M_allocated_capacity = in_stack_fffffffffffff9f8;
      original.field_2._8_8_ = in_stack_fffffffffffffa00;
      Untranslated((bilingual_str *)(local_2e8 + 0x10),original);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._16_8_ == &local_2c8) {
        *puVar1 = CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_2c8._8_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_2e8._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]);
      }
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_2d0;
      local_2d0 = (_Base_ptr)0x0;
      local_2c8._M_local_buf[0] = '\0';
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if (local_2b8 == local_2b0 + 8) {
        *puVar1 = CONCAT71(local_2b0._9_7_,local_2b0[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_2b0._16_8_;
      }
      else {
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_2b8;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_2b0._9_7_,local_2b0[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_2b0._0_8_;
      local_2b0._0_8_ = 0;
      bVar15 = false;
      local_2b0[8] = _S_red;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_2e8._16_8_ = &local_2c8;
      local_2b8 = local_2b0 + 8;
      util::Error::~Error((Error *)(local_2e8 + 0x10));
      local_228._0_8_ = local_2e8._0_8_;
      p_Var26 = local_2f8[0];
      if (local_2f8[0] != (_Base_ptr)local_2e8) goto LAB_0041d6ed;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_590);
  if (!bVar15) goto LAB_0041e06b;
  local_118._0_8_ = &cs_main;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_118);
  pCVar17 = ActiveChainstate(this);
  sVar21 = pCVar17->m_coinsdb_cache_size_bytes;
  pCVar17 = ActiveChainstate(this);
  sVar7 = pCVar17->m_coinstip_cache_size_bytes;
  pCVar17 = ActiveChainstate(this);
  dVar10 = (double)(long)sVar7 * 0.01;
  uVar22 = (ulong)dVar10;
  dVar9 = (double)(long)sVar21 * 0.01;
  uVar25 = (ulong)dVar9;
  Chainstate::ResizeCoinsCaches
            (pCVar17,(long)(dVar10 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22,
             (long)(dVar9 - 9.223372036854776e+18) & (long)uVar25 >> 0x3f | uVar25);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_118);
  local_3e0 = (undefined1  [8])&cs_main;
  local_3d8 = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_3e0);
  this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)operator_new(0xe8);
  uVar22 = CONCAT44(local_70.super__Rb_tree_header._M_node_count._4_4_,
                    (undefined4)local_70.super__Rb_tree_header._M_node_count);
  uVar30 = CONCAT44(uStack_3c,_Stack_40);
  local_118._0_8_ = local_70.super__Rb_tree_header._M_header._M_left;
  local_118._8_8_ = local_70.super__Rb_tree_header._M_header._M_right;
  local_f8[0] = (string)0x1;
  uVar14 = local_f8._0_8_;
  local_f8[0] = (string)0x1;
  uVar27 = SUB84(local_70.super__Rb_tree_header._M_header._M_left,0);
  uVar28 = (undefined4)((ulong)local_70.super__Rb_tree_header._M_header._M_left >> 0x20);
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._8_8_ =
       local_70.super__Rb_tree_header._M_header._M_right;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._0_8_ =
       local_70.super__Rb_tree_header._M_header._M_left;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._16_8_ = uVar22;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._24_8_ = uVar30;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = true;
  p_Var26 = local_70.super__Rb_tree_header._M_header._M_right;
  sVar31 = local_f8[0];
  local_108._0_8_ = uVar22;
  local_108._8_8_ = uVar30;
  local_f8._0_8_ = uVar14;
  Chainstate::Chainstate
            ((Chainstate *)
             this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,(CTxMemPool *)0x0,
             &this->m_blockman,this,from_snapshot_blockhash);
  local_5b0 = (undefined1  [8])
              this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
              super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
              super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_3e0);
  local_118._0_8_ = &cs_main;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_118);
  auVar12 = local_5b0;
  local_3e0 = (undefined1  [8])0x84d8f0;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_320,(char **)local_3e0,auto_format);
  dVar9 = (double)(long)sVar21 * 0.99;
  uVar25 = (ulong)dVar9;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p._4_4_ = uVar28;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p._0_4_ = uVar27;
  leveldb_name.super_path._M_pathname._M_string_length = (size_type)p_Var26;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = uVar22;
  leveldb_name.super_path._M_pathname.field_2._8_8_ = uVar30;
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_1_ =
       (uchar)sVar31;
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._1_7_ =
       in_stack_fffffffffffffa09;
  Chainstate::InitCoinsDB
            ((Chainstate *)auVar12,
             (long)(dVar9 - 9.223372036854776e+18) & (long)uVar25 >> 0x3f | uVar25,in_memory,false,
             leveldb_name);
  std::filesystem::__cxx11::path::~path(&local_320);
  dVar9 = (double)(long)sVar7 * 0.99;
  uVar22 = (ulong)dVar9;
  Chainstate::InitCoinsCache
            ((Chainstate *)local_5b0,
             (long)(dVar9 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_118);
  local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_5b0;
  local_5a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)this;
  PopulateAndValidateSnapshot
            ((Result<void> *)local_118,this,(Chainstate *)local_5b0,coins_file,metadata);
  if ((undefined1)local_e8[2] == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_118);
    local_3e0 = (undefined1  [8])&cs_main;
    local_3d8 = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_3e0);
    pCVar17 = ActiveChainstate(this);
    ppCVar8 = (pCVar17->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar8 ==
        (pCVar17->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar19 = (CBlockIndex *)0x0;
    }
    else {
      pCVar19 = ppCVar8[-1];
    }
    if (*(pointer *)((long)local_5b0 + 0x60) ==
        (((CChain *)((long)local_5b0 + 0x58))->vChain).
        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pb = (CBlockIndex *)0x0;
    }
    else {
      pb = (*(pointer *)((long)local_5b0 + 0x60))[-1];
    }
    bVar15 = ::node::CBlockIndexWorkComparator::operator()
                       ((CBlockIndexWorkComparator *)local_118,pCVar19,pb);
    if (bVar15) {
      if ((in_memory) ||
         (bVar15 = ::node::WriteSnapshotBaseBlockhash((Chainstate *)local_5b0), bVar15)) {
        auVar12 = local_5b0;
        _Var24._M_head_impl =
             (this->m_snapshot_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        if ((_Head_base<0UL,_Chainstate_*,_false>)_Var24._M_head_impl !=
            (_Head_base<0UL,_Chainstate_*,_false>)0x0) {
          __assert_fail("!m_snapshot_chainstate",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ,0x169f,
                        "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                       );
        }
        (this->m_snapshot_chainstate)._M_t.
        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)local_5b0;
        local_5b0 = (undefined1  [8])_Var24._M_head_impl;
        bVar15 = Chainstate::LoadChainTip((Chainstate *)auVar12);
        if (!bVar15) {
          __assert_fail("chaintip_loaded",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ,0x16a2,
                        "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                       );
        }
        uVar18 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
        local_118[0] = uVar18 == 0;
        inline_assertion_check<true,bool>
                  ((bool *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                   ,0x16a6,"ActivateSnapshot","m_active_chainstate->m_mempool->size() == 0");
        local_118[0] = ((this->m_snapshot_chainstate)._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool ==
                       (CTxMemPool *)0x0;
        inline_assertion_check<true,bool>
                  ((bool *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                   ,0x16a7,"ActivateSnapshot","!m_snapshot_chainstate->m_mempool");
        pCVar17 = this->m_active_chainstate;
        ((this->m_snapshot_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool = pCVar17->m_mempool;
        pCVar17->m_mempool = (CTxMemPool *)0x0;
        pCVar17 = (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        this->m_active_chainstate = pCVar17;
        if (pCVar17 == (Chainstate *)0x0) {
          pCVar19 = (CBlockIndex *)0x0;
        }
        else {
          pCVar19 = Chainstate::SnapshotBase(pCVar17);
        }
        if (pCVar19 == (CBlockIndex *)0x0) {
          _Var20._M_payload = (_Storage<int,_true>)0x0;
          _Var20._M_engaged = false;
          _Var20._5_3_ = 0;
        }
        else {
          _Var20 = (_Optional_payload_base<int>)((ulong)(uint)pCVar19->nHeight | 0x100000000);
        }
        (this->m_blockman).m_snapshot_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> = _Var20;
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)local_118,&local_70.super__Rb_tree_header._M_header._M_left);
        pcVar29 = "[snapshot] successfully activated snapshot %s\n";
        logging_function._M_str = "ActivateSnapshot";
        logging_function._M_len = 0x10;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        args_00 = (string *)local_118;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x16ad,ALL,Info,
                   "[snapshot] successfully activated snapshot %s\n",(string *)local_118);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
        }
        this_02 = Chainstate::CoinsTip
                            ((this->m_snapshot_chainstate)._M_t.
                             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        sVar21 = CCoinsViewCache::DynamicMemoryUsage(this_02);
        local_118._0_8_ = sVar21 / 1000000;
        logging_function_00._M_str = "ActivateSnapshot";
        logging_function_00._M_len = 0x10;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x57;
        LogPrintf_<unsigned_long>
                  (logging_function_00,source_file_00,0x16af,
                   IPC|COINDB|PROXY|PRUNE|CMPCTBLOCK|REINDEX|ZMQ|BENCH|HTTP|MEMPOOL,
                   (Level)(string *)local_118,pcVar29,(unsigned_long *)args_00);
        MaybeRebalanceCaches(this);
        *(CBlockIndex **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = pCVar16;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\x01';
      }
      else {
        local_580 = (_Base_ptr)local_570;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_580,"could not write base blockhash","");
        local_560._0_8_ = (_Base_ptr)(local_560 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,local_580,(long)&local_580->_M_color + local_578);
        local_540._M_p = (pointer)&local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_540,local_580,(long)&local_580->_M_color + local_578);
        ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                  ((Error *)local_520,(anon_class_16_2_a94f38f8 *)&local_5a8,
                   (bilingual_str *)local_560);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        pcVar6 = local_520 + 0x10;
        if ((pointer)local_520._0_8_ == pcVar6) {
          *puVar1 = CONCAT71(local_520._17_7_,local_520[0x10]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
               local_520._24_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_520._0_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_520._17_7_,local_520[0x10]);
        }
        p_Var26 = (_Base_ptr)(local_520 + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_520._8_8_;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((_Base_ptr)local_520._32_8_ == p_Var26) {
          *puVar1 = CONCAT71(local_520._49_7_,local_520[0x30]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_520._56_8_;
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_520._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_520._49_7_,local_520[0x30]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_520._40_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_520[0x30] = '\0';
        local_520._40_8_ = 0;
        local_520[0x10] = '\0';
        local_520._8_8_ = 0;
        local_520._0_8_ = pcVar6;
        local_520._32_8_ = p_Var26;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_p != &local_530) {
          operator_delete(local_540._M_p,(ulong)(local_530._M_allocated_capacity + 1));
        }
        if ((_Base_ptr)local_560._0_8_ != (_Base_ptr)(local_560 + 0x10)) {
          operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
        }
        local_4d0[0] = local_570[0];
        p_Var26 = local_580;
        if (local_580 != (_Base_ptr)local_570) goto LAB_0041df3e;
      }
    }
    else {
      local_4e0 = (_Base_ptr)local_4d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4e0,"work does not exceed active chainstate","");
      local_4c0._0_8_ = (_Base_ptr)(local_4c0 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4c0,local_4e0,
                 (long)&local_4e0->_M_color + (long)&local_4d8->_M_color);
      local_4a0._M_p = (pointer)&local_490;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a0,local_4e0,
                 (long)&local_4e0->_M_color + (long)&local_4d8->_M_color);
      ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                (&local_480,(anon_class_16_2_a94f38f8 *)&local_5a8,(bilingual_str *)local_4c0);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      paVar4 = &local_480.message.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480.message.original._M_dataplus._M_p == paVar4) {
        *puVar1 = CONCAT71(local_480.message.original.field_2._M_allocated_capacity._1_7_,
                           local_480.message.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_480.message.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
             local_480.message.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_480.message.original.field_2._M_allocated_capacity._1_7_,
                      local_480.message.original.field_2._M_local_buf[0]);
      }
      paVar5 = &local_480.message.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
           local_480.message.original._M_string_length;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480.message.translated._M_dataplus._M_p == paVar5) {
        *puVar1 = CONCAT71(local_480.message.translated.field_2._M_allocated_capacity._1_7_,
                           local_480.message.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_480.message.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_480.message.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_480.message.translated.field_2._M_allocated_capacity._1_7_,
                      local_480.message.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_480.message.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_480.message.translated.field_2._M_local_buf[0] = '\0';
      local_480.message.translated._M_string_length = 0;
      local_480.message.original.field_2._M_local_buf[0] = '\0';
      local_480.message.original._M_string_length = 0;
      local_480.message.original._M_dataplus._M_p = (pointer)paVar4;
      local_480.message.translated._M_dataplus._M_p = (pointer)paVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != &local_490) {
        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
      }
      if ((_Base_ptr)local_4c0._0_8_ != (_Base_ptr)(local_4c0 + 0x10)) {
        operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
      }
      p_Var26 = local_4e0;
      if (local_4e0 != (_Base_ptr)local_4d0) {
LAB_0041df3e:
        operator_delete(p_Var26,(ulong)((long)&local_4d0[0]->_M_color + 1));
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_3e0);
  }
  else {
    local_590._M_device = &cs_main.super_recursive_mutex;
    local_590._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_590);
    local_400 = local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Population failed: %s","")
    ;
    local_3e0 = (undefined1  [8])&local_3d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3e0,local_400,(long)local_400 + local_3f8);
    local_3c0._M_p = (pointer)&local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_400,(long)local_400 + local_3f8);
    util::ErrorString<void>((bilingual_str *)local_440,(Result<void> *)local_118);
    tinyformat::format<bilingual_str>
              ((bilingual_str *)local_3a0,(bilingual_str *)local_3e0,(bilingual_str *)local_440);
    ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
              (&local_360,(anon_class_16_2_a94f38f8 *)&local_5a8,(bilingual_str *)local_3a0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    paVar4 = &local_360.message.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.message.original._M_dataplus._M_p == paVar4) {
      *puVar1 = CONCAT71(local_360.message.original.field_2._M_allocated_capacity._1_7_,
                         local_360.message.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
           local_360.message.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
           local_360.message.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_360.message.original.field_2._M_allocated_capacity._1_7_,
                    local_360.message.original.field_2._M_local_buf[0]);
    }
    paVar5 = &local_360.message.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
         local_360.message.original._M_string_length;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.message.translated._M_dataplus._M_p == paVar5) {
      *puVar1 = CONCAT71(local_360.message.translated.field_2._M_allocated_capacity._1_7_,
                         local_360.message.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
           local_360.message.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
           local_360.message.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_360.message.translated.field_2._M_allocated_capacity._1_7_,
                    local_360.message.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
         local_360.message.translated._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_360.message.translated.field_2._M_local_buf[0] = '\0';
    local_360.message.translated._M_string_length = 0;
    local_360.message.original.field_2._M_local_buf[0] = '\0';
    local_360.message.original._M_string_length = 0;
    local_360.message.original._M_dataplus._M_p = (pointer)paVar4;
    local_360.message.translated._M_dataplus._M_p = (pointer)paVar5;
    if ((_Base_ptr)local_3a0._32_8_ != (_Base_ptr)(local_3a0 + 0x30)) {
      operator_delete((void *)local_3a0._32_8_,local_3a0._48_8_ + 1);
    }
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
    }
    if ((_Base_ptr)local_420._M_p != (_Base_ptr)(local_440 + 0x30)) {
      operator_delete(local_420._M_p,(ulong)(local_410._M_allocated_capacity + 1));
    }
    if ((RecursiveMutex *)local_440._0_8_ != (RecursiveMutex *)(local_440 + 0x10)) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
    }
    if (local_3e0 != (undefined1  [8])&local_3d0) {
      operator_delete((void *)local_3e0,local_3d0._M_allocated_capacity + 1);
    }
    if (local_400 != local_3f0) {
      operator_delete(local_400,(ulong)((long)&local_3f0[0]->_M_color + 1));
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_590);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_118);
  }
  if (local_5b0 != (undefined1  [8])0x0) {
    std::default_delete<Chainstate>::operator()
              ((default_delete<Chainstate> *)local_5b0,(Chainstate *)local_5b0);
  }
LAB_0041e06b:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }